

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_JXS.cpp
# Opt level: O0

h__Writer * __thiscall
AS_02::JXS::MXFWriter::h__Writer::WriteFrame
          (h__Writer *this,FrameBuffer *FrameBuf,AESEncContext *Ctx,HMACContext *HMAC)

{
  bool bVar1;
  ui32_t uVar2;
  int iVar3;
  ILogSink *this_00;
  undefined1 local_118 [104];
  h__WriterState local_b0 [31];
  undefined1 local_31;
  HMACContext *HMAC_local;
  AESEncContext *Ctx_local;
  FrameBuffer *FrameBuf_local;
  h__Writer *this_local;
  Result_t *result;
  
  HMAC_local = HMAC;
  Ctx_local = Ctx;
  FrameBuf_local = FrameBuf;
  this_local = this;
  uVar2 = ASDCP::FrameBuffer::Size((FrameBuffer *)Ctx);
  if (uVar2 == 0) {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(this_00,"The frame buffer size is zero.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
  }
  else {
    local_31 = 0;
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    bVar1 = ASDCP::MXF::h__WriterState::Test_READY((h__WriterState *)(FrameBuf + 0x370));
    if (bVar1) {
      ASDCP::MXF::h__WriterState::Goto_RUNNING(local_b0);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_b0);
      Kumu::Result_t::~Result_t((Result_t *)local_b0);
    }
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
    if (-1 < iVar3) {
      h__AS02WriterFrame::WriteEKLVPacket
                ((h__AS02WriterFrame *)local_118,(FrameBuffer *)FrameBuf,(byte_t *)Ctx_local,
                 (ui32_t *)(FrameBuf + 0x5b0),(AESEncContext *)&ASDCP::MXF_BER_LENGTH,HMAC_local);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)local_118);
      Kumu::Result_t::~Result_t((Result_t *)local_118);
      *(int *)(FrameBuf + 0x338) = *(int *)(FrameBuf + 0x338) + 1;
    }
  }
  return this;
}

Assistant:

Result_t
AS_02::JXS::MXFWriter::h__Writer::WriteFrame(const ASDCP::JXS::FrameBuffer& FrameBuf,
					      AESEncContext* Ctx, HMACContext* HMAC)
{
  if ( FrameBuf.Size() == 0 )
    {
      DefaultLogSink().Error("The frame buffer size is zero.\n");
      return RESULT_PARAM;
    }

  Result_t result = RESULT_OK;

  if ( m_State.Test_READY() )
    {
      result = m_State.Goto_RUNNING(); // first time through
    }

  if ( KM_SUCCESS(result) )
    {
      result = WriteEKLVPacket(FrameBuf, m_EssenceUL, MXF_BER_LENGTH, Ctx, HMAC);
      m_FramesWritten++;
    }

  return result;
}